

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetRepeatedMessage
          (ExtensionSet *this,int number,int index)

{
  Extension *pEVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar2;
  Nonnull<const_char_*> pcVar3;
  LogMessage *v1;
  string_view str;
  LogMessage local_20;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x33f,"extension != nullptr");
    str._M_str = "Index out-of-bounds (field is empty).";
    str._M_len = 0x25;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_20,str);
    goto LAB_002885bc;
  }
  if (pEVar1->is_repeated == false) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (1,0,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if ((byte)(pEVar1->type - 0x13) < 0xee) {
      v1 = &local_20;
      GetRepeatedMessage();
LAB_0028858c:
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)v1,10,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    }
    else {
      v1 = (LogMessage *)
           (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4);
      if (v1 != (LogMessage *)0xa) goto LAB_0028858c;
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      pVVar2 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                         ((RepeatedPtrFieldBase *)pEVar1->field_0,index);
      return pVVar2;
    }
  }
  else {
    GetRepeatedMessage();
  }
  GetRepeatedMessage();
LAB_002885bc:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

const MessageLite& ExtensionSet::GetRepeatedMessage(int number,
                                                    int index) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  return extension->ptr.repeated_message_value->Get(index);
}